

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding2.c
# Opt level: O1

void method_getArgumentType(Method method,uint index,char *dst,size_t dst_len)

{
  char *type;
  char *pcVar1;
  uint uVar2;
  ulong __n;
  size_t ignored;
  size_t local_30;
  
  if (method != (Method)0x0) {
    type = sel_getType_np(method->selector);
    uVar2 = 0;
    do {
      type = objc_skip_argspec(type);
      if (*type == '\0') {
        type = (char *)0x0;
        break;
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 <= index);
    if (type == (char *)0x0) {
      if (dst_len != 0) {
        *dst = '\0';
      }
    }
    else {
      if (*type == '\0') {
        __n = 0;
      }
      else {
        local_30 = 0;
        pcVar1 = sizeof_type(type,&local_30);
        __n = (long)pcVar1 - (long)type;
      }
      if (__n < dst_len) {
        memcpy(dst,type,__n);
        dst[__n] = '\0';
      }
      else {
        memcpy(dst,type,dst_len);
      }
    }
  }
  return;
}

Assistant:

OBJC_PUBLIC
void method_getArgumentType(Method method,
                            unsigned int index,
                            char *dst,
                            size_t dst_len)
{
	if (NULL == method) { return; }
	const char *types = findParameterStart(method_getTypeEncoding(method), index);
	if (NULL == types)
	{
		if (dst_len > 0)
		{
			*dst = '\0';
		}
		return;
	}
	size_t length = lengthOfTypeEncoding(types);
	if (length < dst_len)
	{
		memcpy(dst, types, length);
		dst[length] = '\0';
	}
	else
	{
		memcpy(dst, types, dst_len);
	}
}